

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

ON_Interval __thiscall ON_Evaluator::Domain(ON_Evaluator *this,int parameter_index)

{
  int iVar1;
  int iVar2;
  ON_Interval *pOVar3;
  ON_Interval OVar4;
  int parameter_index_local;
  ON_Evaluator *this_local;
  double local_10;
  
  iVar1 = this->m_parameter_count;
  iVar2 = ON_SimpleArray<ON_Interval>::Count(&this->m_domain);
  if ((iVar1 == iVar2) && (0 < this->m_parameter_count)) {
    pOVar3 = ON_SimpleArray<ON_Interval>::operator[](&this->m_domain,parameter_index);
    this_local = (ON_Evaluator *)pOVar3->m_t[0];
    local_10 = pOVar3->m_t[1];
  }
  else {
    ON_Interval::ON_Interval((ON_Interval *)&this_local,-1e+300,1e+300);
  }
  OVar4.m_t[0] = (double)this_local;
  OVar4.m_t[1] = local_10;
  return (ON_Interval)OVar4.m_t;
}

Assistant:

ON_Interval ON_Evaluator::Domain(
  int parameter_index
  ) const
{
  return ((m_parameter_count==m_domain.Count() && m_parameter_count>0) 
          ? m_domain[parameter_index] 
          : ON_Interval(-1.0e300,1.0e300)
          );
}